

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *piVar2;
  string local_118 [52];
  int local_e4;
  string local_e0 [4];
  int counter;
  string order_data;
  undefined1 local_c0 [8];
  CPU RISC_V_CPU;
  
  RISC_V_CPU.CPU_MEM.mem._4_4_ = 0;
  CPU::CPU((CPU *)local_c0,1000000);
  std::__cxx11::string::string(local_e0);
  local_e4 = 0;
  while( true ) {
    piVar2 = std::operator>>((istream *)&std::cin,local_e0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::string(local_118,local_e0);
    memory::push((memory *)&RISC_V_CPU.current_order,(string *)local_118);
    std::__cxx11::string::~string(local_118);
    local_e4 = local_e4 + 1;
  }
  CPU::run((CPU *)local_c0);
  RISC_V_CPU.CPU_MEM.mem._4_4_ = 0;
  std::__cxx11::string::~string(local_e0);
  return RISC_V_CPU.CPU_MEM.mem._4_4_;
}

Assistant:

int main() {
    CPU RISC_V_CPU;
    string order_data;
    int counter=0;
    while(cin>>order_data){
        RISC_V_CPU.CPU_MEM.push(order_data);
        ++counter;
    }
    RISC_V_CPU.run();
    return 0;
}